

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

polylabel *
Search::allowed_actions_to_ld
          (search_private *priv,size_t ec_cnt,action *allowed_actions,size_t allowed_actions_cnt,
          float *allowed_actions_cost)

{
  bool bVar1;
  polylabel *this;
  uint uVar2;
  ulong uVar3;
  size_t i;
  size_t sVar4;
  action k;
  uint32_t uVar5;
  ulong uVar6;
  bool bVar7;
  cb_class local_48;
  float *local_38;
  
  this = priv->allowed_actions_cache;
  bVar1 = priv->cb_learner;
  uVar6 = (long)(this->cs).costs._end - (long)(this->cs).costs._begin >> 4;
  local_38 = allowed_actions_cost;
  if (priv->is_ldf == true) {
    uVar3 = uVar6 & 0xffffffff;
    if (ec_cnt < uVar3) {
      if (bVar1 == false) {
        v_array<COST_SENSITIVE::wclass>::resize
                  ((v_array<COST_SENSITIVE::wclass> *)&this->simple,ec_cnt);
      }
      else {
        v_array<CB::cb_class>::resize((v_array<CB::cb_class> *)&this->simple,ec_cnt);
      }
    }
    else {
      while (uVar3 < ec_cnt) {
        uVar5 = (uint32_t)uVar6;
        local_48.action = uVar5;
        if (bVar1 == false) {
          local_48.cost = 3.4028235e+38;
          local_48.probability = 0.0;
          local_48.partial_prediction = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back
                    ((v_array<COST_SENSITIVE::wclass> *)&this->simple,(wclass *)&local_48);
        }
        else {
          local_48.cost = 3.4028235e+38;
          local_48.probability = 0.0;
          local_48.partial_prediction = 0.0;
          v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&this->simple,&local_48);
        }
        uVar6 = (ulong)(uVar5 + 1);
        uVar3 = uVar6;
      }
    }
  }
  else if (priv->use_action_costs == true) {
    if (allowed_actions == (action *)0x0) {
      if (uVar6 != priv->A) {
        if (bVar1 == false) {
          v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&this->simple);
        }
        else {
          v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&this->simple);
        }
        if (priv->A == 0) {
          return this;
        }
        uVar3 = 1;
        do {
          uVar5 = (uint32_t)uVar3;
          local_48.action = uVar5;
          if (bVar1 == false) {
            local_48.cost = 0.0;
            local_48.probability = 0.0;
            local_48.partial_prediction = 0.0;
            v_array<COST_SENSITIVE::wclass>::push_back
                      ((v_array<COST_SENSITIVE::wclass> *)&this->simple,(wclass *)&local_48);
          }
          else {
            local_48.cost = 0.0;
            local_48.probability = 0.0;
            local_48.partial_prediction = 0.0;
            v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&this->simple,&local_48);
          }
          uVar6 = priv->A;
          bVar7 = uVar3 < uVar6;
          uVar3 = (ulong)(uVar5 + 1);
        } while (bVar7);
      }
      if (uVar6 != 0) {
        uVar2 = 1;
        uVar6 = 0;
        do {
          ((cb_class *)(this->cs).costs._begin)[uVar6].cost = local_38[uVar6];
          uVar6 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
        } while (uVar6 < priv->A);
      }
    }
    else {
      if (bVar1 == false) {
        v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&this->simple);
      }
      else {
        v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&this->simple);
      }
      if (allowed_actions_cnt != 0) {
        uVar6 = 0;
        uVar3 = 1;
        do {
          local_48.action = allowed_actions[uVar6];
          local_48.cost = local_38[uVar6];
          if (bVar1 == false) {
            local_48.probability = 0.0;
            local_48.partial_prediction = 0.0;
            v_array<COST_SENSITIVE::wclass>::push_back
                      ((v_array<COST_SENSITIVE::wclass> *)&this->simple,(wclass *)&local_48);
          }
          else {
            local_48.probability = 0.0;
            local_48.partial_prediction = 0.0;
            v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&this->simple,&local_48);
          }
          bVar7 = uVar3 < allowed_actions_cnt;
          uVar6 = uVar3;
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (bVar7);
      }
    }
  }
  else if (allowed_actions == (action *)0x0 || allowed_actions_cnt == 0) {
    if ((uVar6 & 0xffffffff) != priv->A) {
      if (bVar1 == false) {
        v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&this->simple);
      }
      else {
        v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&this->simple);
      }
      if (priv->A != 0) {
        uVar6 = 1;
        do {
          uVar5 = (uint32_t)uVar6;
          local_48.action = uVar5;
          if (bVar1 == false) {
            local_48.cost = 3.4028235e+38;
            local_48.probability = 0.0;
            local_48.partial_prediction = 0.0;
            v_array<COST_SENSITIVE::wclass>::push_back
                      ((v_array<COST_SENSITIVE::wclass> *)&this->simple,(wclass *)&local_48);
          }
          else {
            local_48.cost = 3.4028235e+38;
            local_48.probability = 0.0;
            local_48.partial_prediction = 0.0;
            v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&this->simple,&local_48);
          }
          bVar7 = uVar6 < priv->A;
          uVar6 = (ulong)(uVar5 + 1);
        } while (bVar7);
      }
    }
  }
  else {
    if (bVar1 == false) {
      v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&this->simple);
    }
    else {
      v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&this->simple);
    }
    sVar4 = 0;
    do {
      local_48.action = allowed_actions[sVar4];
      if (bVar1 == false) {
        local_48.cost = 3.4028235e+38;
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<COST_SENSITIVE::wclass>::push_back
                  ((v_array<COST_SENSITIVE::wclass> *)&this->simple,(wclass *)&local_48);
      }
      else {
        local_48.cost = 3.4028235e+38;
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&this->simple,&local_48);
      }
      sVar4 = sVar4 + 1;
    } while (allowed_actions_cnt != sVar4);
  }
  return this;
}

Assistant:

polylabel& allowed_actions_to_ld(search_private& priv, size_t ec_cnt, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost)
{
  bool isCB = priv.cb_learner;
  polylabel& ld = *priv.allowed_actions_cache;
  uint32_t num_costs = (uint32_t)cs_get_costs_size(isCB, ld);

  if (priv.is_ldf)  // LDF version easier
  {
    if (num_costs > ec_cnt)
      cs_costs_resize(isCB, ld, ec_cnt);
    else if (num_costs < ec_cnt)
      for (action k = num_costs; k < ec_cnt; k++) cs_cost_push_back(isCB, ld, k, FLT_MAX);
  }
  else if (priv.use_action_costs)
  {
    // TODO: Weight
    if (allowed_actions == nullptr)
    {
      if (cs_get_costs_size(isCB, ld) != priv.A)
      {
        cs_costs_erase(isCB, ld);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, ld, k + 1, 0.);
      }
      for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, ld, k, allowed_actions_cost[k]);
    }
    else  // manually specified actions
    {
      cs_costs_erase(isCB, ld);
      for (action k = 0; k < allowed_actions_cnt; k++)
        cs_cost_push_back(isCB, ld, allowed_actions[k], allowed_actions_cost[k]);
    }
  }
  else  // non-LDF version, no action costs
  {
    if ((allowed_actions == nullptr) || (allowed_actions_cnt == 0))  // any action is allowed
    {
      if (num_costs != priv.A)  // if there are already A-many actions, they must be the right ones, unless the user did
                                // something stupid like putting duplicate allowed_actions...
      {
        cs_costs_erase(isCB, ld);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, ld, k + 1, FLT_MAX);  //+1 because MC is 1-based
      }
    }
    else  // we need to peek at allowed_actions
    {
      cs_costs_erase(isCB, ld);
      for (size_t i = 0; i < allowed_actions_cnt; i++) cs_cost_push_back(isCB, ld, allowed_actions[i], FLT_MAX);
    }
  }

  return ld;
}